

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  short sVar2;
  stbi__uint32 sVar3;
  short sVar4;
  bool bVar5;
  byte bVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  uchar uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  stbi__jpeg *z;
  char *pcVar18;
  long lVar19;
  void *pvVar20;
  code *pcVar21;
  void *pvVar22;
  undefined8 *puVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  undefined8 *puVar27;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *paVar28;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 uVar29;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *psVar30;
  stbi_uc **ppsVar31;
  undefined1 *puVar32;
  byte *pbVar33;
  stbi__context *psVar34;
  ulong uVar35;
  stbi__huffman *h;
  uint uVar36;
  stbi_uc *psVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  short *psVar42;
  long in_FS_OFFSET;
  bool bVar43;
  undefined1 auVar44 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1b4;
  ulong local_1a8;
  ulong local_188;
  stbi_uc *local_158 [5];
  int local_130;
  int local_12c;
  anon_struct_96_18_0d0905d3 *local_128;
  long local_120;
  stbi__huffman *local_118;
  stbi__uint32 *local_110;
  stbi__uint32 *local_108;
  int *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_110 = (stbi__uint32 *)x;
  local_108 = (stbi__uint32 *)y;
  local_100 = comp;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  memset(z,0,0x4888);
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    paVar1 = z->img_comp;
    lVar19 = 0x46d8;
    do {
      psVar30 = z->huff_dc[0].fast + lVar19 + -8;
      psVar30[0] = '\0';
      psVar30[1] = '\0';
      psVar30[2] = '\0';
      psVar30[3] = '\0';
      psVar30[4] = '\0';
      psVar30[5] = '\0';
      psVar30[6] = '\0';
      psVar30[7] = '\0';
      psVar30[8] = '\0';
      psVar30[9] = '\0';
      psVar30[10] = '\0';
      psVar30[0xb] = '\0';
      psVar30[0xc] = '\0';
      psVar30[0xd] = '\0';
      psVar30[0xe] = '\0';
      psVar30[0xf] = '\0';
      lVar19 = lVar19 + 0x60;
    } while (lVar19 != 0x4858);
    z->restart_interval = 0;
    iVar13 = stbi__decode_jpeg_header(z,0);
    uVar25 = extraout_EDX;
    if (iVar13 == 0) {
LAB_0010aad6:
      uVar36 = z->s->img_n;
    }
    else {
      bVar6 = stbi__get_marker(z);
      uVar36 = (uint)bVar6;
      uVar29 = extraout_RDX;
LAB_0010911d:
      uVar25 = (uint)uVar29;
      if (uVar36 == 0xda) {
        psVar34 = z->s;
        sVar7 = stbi__get8(psVar34);
        sVar8 = stbi__get8(psVar34);
        bVar6 = stbi__get8(z->s);
        z->scan_n = (uint)bVar6;
        if ((0xfb < (byte)(bVar6 - 5)) && ((int)(uint)bVar6 <= z->s->img_n)) {
          paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar7,sVar8);
          if ((uint)CONCAT11(sVar7,sVar8) != (uint)bVar6 * 2 + 6) {
            pcVar18 = "bad SOS len";
            goto LAB_0010aacd;
          }
          if (bVar6 != 0) {
            lVar19 = 0;
            do {
              bVar6 = stbi__get8(z->s);
              bVar11 = stbi__get8(z->s);
              uVar25 = z->s->img_n;
              if ((int)uVar25 < 1) {
                uVar38 = 0;
              }
              else {
                uVar38 = 0;
                paVar28 = paVar1;
                do {
                  if (paVar28->id == (uint)bVar6) goto LAB_0010927a;
                  uVar38 = uVar38 + 1;
                  paVar28 = paVar28 + 1;
                } while (uVar25 != uVar38);
                uVar38 = (ulong)uVar25;
              }
LAB_0010927a:
              if ((uint)uVar38 == uVar25) goto LAB_0010aad6;
              uVar35 = uVar38 & 0xffffffff;
              paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar35 * 0x60);
              z->img_comp[uVar35].hd = (uint)(bVar11 >> 4);
              if (0x3f < bVar11) {
                pcVar18 = "bad DC huff";
                goto LAB_0010aacd;
              }
              paVar28 = paVar1 + uVar35;
              paVar28->ha = bVar11 & 0xf;
              if (3 < (bVar11 & 0xf)) {
                pcVar18 = "bad AC huff";
                goto LAB_0010aacd;
              }
              z->order[lVar19] = (uint)uVar38;
              lVar19 = lVar19 + 1;
            } while (lVar19 < z->scan_n);
          }
          bVar6 = stbi__get8(z->s);
          z->spec_start = (uint)bVar6;
          bVar6 = stbi__get8(z->s);
          z->spec_end = (uint)bVar6;
          bVar6 = stbi__get8(z->s);
          z->succ_high = (uint)(bVar6 >> 4);
          uVar25 = bVar6 & 0xf;
          paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar25;
          z->succ_low = uVar25;
          iVar13 = z->progressive;
          iVar17 = z->spec_start;
          if (iVar13 == 0) {
            if (((iVar17 != 0) || (0xf < bVar6)) || ((bVar6 & 0xf) != 0)) goto LAB_0010a111;
            z->spec_end = 0x3f;
          }
          else if (((0x3f < iVar17) || (0x3f < z->spec_end)) ||
                  ((z->spec_end < iVar17 || ((0xdf < bVar6 || (0xd < uVar25)))))) {
LAB_0010a111:
            pcVar18 = "bad SOS";
            goto LAB_0010aacd;
          }
          iVar17 = z->scan_n;
          uVar38 = (ulong)(uint)z->restart_interval;
          if (z->restart_interval == 0) {
            uVar38 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          uVar25 = (uint)uVar38;
          z->todo = uVar25;
          z->eob_run = 0;
          if (iVar13 == 0) {
            if (iVar17 == 1) {
              iVar13 = z->order[0];
              uVar36 = z->img_comp[iVar13].y + 7 >> 3;
              uVar35 = 1;
              local_188 = (ulong)uVar36;
              if (0 < (int)uVar36) {
                uVar41 = paVar1[iVar13].x + 7 >> 3;
                iVar17 = 0;
                uVar15 = 0;
                do {
                  if (0 < (int)uVar41) {
                    lVar19 = 0;
                    do {
                      iVar39 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar13].hd,
                                          z->huff_ac + paVar1[iVar13].ha,
                                          z->fast_ac[paVar1[iVar13].ha],iVar13,
                                          z->dequant[paVar1[iVar13].tq]);
                      if (iVar39 == 0) {
                        bVar43 = false;
                        local_1a8 = 0;
                        uVar38 = extraout_RDX_06;
                      }
                      else {
                        (*z->idct_block_kernel)
                                  (paVar1[iVar13].data + lVar19 + iVar17 * paVar1[iVar13].w2,
                                   paVar1[iVar13].w2,local_f8);
                        iVar39 = z->todo;
                        z->todo = iVar39 + -1;
                        bVar43 = true;
                        uVar38 = extraout_RDX_07;
                        if (iVar39 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar38 = extraout_RDX_08;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar39 = z->restart_interval;
                            uVar38 = 0x7fffffff;
                            if (iVar39 == 0) {
                              iVar39 = 0x7fffffff;
                            }
                            z->todo = iVar39;
                            z->eob_run = 0;
                          }
                          else {
                            local_1a8 = 1;
                            bVar43 = false;
                          }
                        }
                      }
                      uVar25 = (uint)uVar38;
                      if (!bVar43) {
                        uVar35 = local_1a8 & 0xffffffff;
                        goto LAB_0010a007;
                      }
                      lVar19 = lVar19 + 8;
                    } while ((ulong)uVar41 * 8 - lVar19 != 0);
                  }
                  uVar25 = (uint)uVar38;
                  uVar15 = uVar15 + 1;
                  iVar17 = iVar17 + 8;
                } while (uVar15 != uVar36);
                uVar35 = 1;
              }
            }
            else {
              uVar35 = 1;
              if (0 < z->img_mcu_y) {
                iVar13 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    local_1b4 = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar19 = 0;
                        do {
                          iVar17 = z->order[lVar19];
                          local_1a8 = (ulong)iVar17;
                          if (0 < z->img_comp[local_1a8].v) {
                            iVar39 = 0;
                            bVar43 = true;
                            do {
                              local_188 = CONCAT71(local_188._1_7_,bVar43);
                              iVar24 = paVar1[local_1a8].h;
                              if (0 < iVar24) {
                                iVar14 = 0;
                                do {
                                  iVar40 = paVar1[local_1a8].v;
                                  iVar16 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[local_1a8].hd,
                                                      z->huff_ac + paVar1[local_1a8].ha,
                                                      z->fast_ac[paVar1[local_1a8].ha],iVar17,
                                                      z->dequant[paVar1[local_1a8].tq]);
                                  uVar25 = (uint)extraout_RDX_10;
                                  if (iVar16 == 0) {
                                    uVar38 = extraout_RDX_10;
                                    if (bVar43 != false) goto LAB_00109fe7;
                                    goto LAB_00109ee7;
                                  }
                                  (*z->idct_block_kernel)
                                            (paVar1[local_1a8].data +
                                             (long)((iVar24 * local_1b4 + iVar14) * 8) +
                                             (long)((iVar40 * iVar13 + iVar39) *
                                                    paVar1[local_1a8].w2 * 8),paVar1[local_1a8].w2,
                                             local_f8);
                                  iVar14 = iVar14 + 1;
                                  iVar24 = paVar1[local_1a8].h;
                                  uVar38 = extraout_RDX_11;
                                } while (iVar14 < iVar24);
                              }
                              iVar39 = iVar39 + 1;
                              bVar43 = iVar39 < paVar1[local_1a8].v;
                            } while (iVar39 < paVar1[local_1a8].v);
                          }
LAB_00109ee7:
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < z->scan_n);
                      }
                      uVar25 = (uint)uVar38;
                      iVar17 = z->todo;
                      z->todo = iVar17 + -1;
                      uVar35 = 1;
                      if (iVar17 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar25 = extraout_EDX_02;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_0010a007;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar17 = z->restart_interval;
                        uVar38 = 0x7fffffff;
                        if (iVar17 == 0) {
                          iVar17 = 0x7fffffff;
                        }
                        z->todo = iVar17;
                        z->eob_run = 0;
                      }
                      local_1b4 = local_1b4 + 1;
                    } while (local_1b4 < z->img_mcu_x);
                  }
                  uVar25 = (uint)uVar38;
                  uVar35 = 1;
                  iVar13 = iVar13 + 1;
                } while (iVar13 < z->img_mcu_y);
              }
            }
          }
          else if (iVar17 == 1) {
            local_120 = (long)z->order[0];
            local_12c = z->img_comp[local_120].y + 7 >> 3;
            uVar35 = 1;
            if (0 < local_12c) {
              paVar28 = paVar1 + local_120;
              local_130 = z->img_comp[local_120].x + 7 >> 3;
              iVar13 = 0;
              local_128 = paVar28;
              do {
                if (0 < local_130) {
                  iVar17 = 0;
                  do {
                    psVar42 = paVar28->coeff + (paVar28->coeff_w * iVar13 + iVar17) * 0x40;
                    uVar35 = (ulong)z->spec_start;
                    if (uVar35 == 0) {
                      iVar39 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar42,z->huff_dc + paVar28->hd,(int)local_120);
                      uVar38 = extraout_RDX_04;
                      if (iVar39 != 0) goto LAB_00109781;
                      bVar43 = false;
                      local_188 = 0;
                    }
                    else {
                      iVar39 = paVar28->ha;
                      h = z->huff_ac + iVar39;
                      iVar24 = z->eob_run;
                      bVar6 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar24 == 0) {
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            sVar2 = z->fast_ac[iVar39][z->code_buffer >> 0x17];
                            uVar25 = (uint)sVar2;
                            iVar24 = (int)uVar35;
                            if (sVar2 == 0) {
                              uVar25 = stbi__jpeg_huff_decode(z,h);
                              if ((int)uVar25 < 0) goto LAB_0010992f;
                              uVar36 = uVar25 >> 4;
                              if ((uVar25 & 0xf) == 0) {
                                if (0xef < uVar25) {
                                  uVar35 = (ulong)(iVar24 + 0x10);
                                  goto LAB_00109988;
                                }
                                z->eob_run = 1 << ((byte)uVar36 & 0x1f);
                                if (0xf < uVar25) {
                                  iVar24 = stbi__jpeg_get_bits(z,uVar36);
                                  z->eob_run = z->eob_run + iVar24;
                                }
                                z->eob_run = z->eob_run + -1;
                                iVar24 = 2;
                                goto LAB_00109944;
                              }
                              uVar35 = (ulong)((int)((long)iVar24 + (ulong)uVar36) + 1);
                              bVar11 = ""[(long)iVar24 + (ulong)uVar36];
                              iVar24 = stbi__extend_receive(z,uVar25 & 0xf);
                              psVar42[bVar11] = (short)(iVar24 << (bVar6 & 0x1f));
LAB_00109988:
                              iVar24 = 0;
                              bVar43 = true;
                            }
                            else {
                              uVar41 = iVar24 + (uVar25 >> 4 & 0xf);
                              uVar35 = (ulong)uVar41;
                              uVar36 = uVar25 & 0xf;
                              if ((int)uVar36 <= z->code_bits) {
                                z->code_buffer = z->code_buffer << (sbyte)uVar36;
                                z->code_bits = z->code_bits - uVar36;
                                uVar35 = (ulong)(uVar41 + 1);
                                psVar42[""[(int)uVar41]] = (short)((uVar25 >> 8) << (bVar6 & 0x1f));
                                goto LAB_00109988;
                              }
LAB_0010992f:
                              *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                              iVar24 = 1;
LAB_00109944:
                              bVar43 = false;
                            }
                            uVar38 = 0;
                            bVar5 = true;
                            if (iVar24 != 0) {
                              if (iVar24 != 2) {
                                bVar5 = bVar43;
                              }
                              break;
                            }
                          } while ((int)uVar35 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar24 + -1;
                          uVar38 = 1;
                          bVar5 = false;
                        }
                        if (bVar5) goto LAB_00109757;
                      }
                      else {
                        if (iVar24 == 0) {
                          iVar39 = 0x10000 << (bVar6 & 0x1f);
                          local_118 = h;
                          do {
                            uVar25 = stbi__jpeg_huff_decode(z,h);
                            if ((int)uVar25 < 0) {
LAB_0010967c:
                              *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                              bVar43 = false;
                            }
                            else {
                              uVar36 = uVar25 >> 4;
                              if ((uVar25 & 0xf) == 1) {
                                iVar14 = stbi__jpeg_get_bit(z);
                                iVar24 = 1;
                                if (iVar14 == 0) {
                                  iVar24 = 0xffff;
                                }
                                local_1a8 = (ulong)(uint)(iVar24 << (bVar6 & 0x1f));
                              }
                              else {
                                if ((uVar25 & 0xf) != 0) goto LAB_0010967c;
                                if (uVar25 < 0xf0) {
                                  z->eob_run = ~(-1 << ((byte)uVar36 & 0x1f));
                                  uVar41 = 0x40;
                                  if (0xf < uVar25) {
                                    iVar24 = stbi__jpeg_get_bits(z,uVar36);
                                    z->eob_run = z->eob_run + iVar24;
                                  }
                                }
                                else {
                                  uVar41 = 0xf;
                                }
                                uVar36 = uVar41;
                                local_1a8 = 0;
                              }
                              uVar35 = (ulong)(int)uVar35;
                              do {
                                if ((long)z->spec_end < (long)uVar35) break;
                                bVar11 = ""[uVar35];
                                if (psVar42[bVar11] == 0) {
                                  if (uVar36 == 0) {
                                    psVar42[bVar11] = (short)local_1a8;
                                    bVar43 = false;
                                    uVar36 = 0;
                                  }
                                  else {
                                    uVar36 = uVar36 - 1;
                                    bVar43 = true;
                                  }
                                }
                                else {
                                  iVar24 = stbi__jpeg_get_bit(z);
                                  bVar43 = true;
                                  if ((iVar24 != 0) &&
                                     (sVar2 = psVar42[bVar11], (iVar39 >> 0x10 & (int)sVar2) == 0))
                                  {
                                    sVar4 = (short)((uint)iVar39 >> 0x10);
                                    if (sVar2 < 1) {
                                      sVar4 = -sVar4;
                                    }
                                    psVar42[bVar11] = sVar2 + sVar4;
                                  }
                                }
                                uVar35 = uVar35 + 1;
                              } while (bVar43);
                              bVar43 = true;
                              h = local_118;
                            }
                            if (!bVar43) {
                              uVar38 = 0;
                              goto LAB_0010975c;
                            }
                          } while ((int)uVar35 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar24 + -1;
                          if (z->spec_start <= z->spec_end) {
                            uVar25 = (0x10000 << (bVar6 & 0x1f)) >> 0x10;
                            do {
                              bVar6 = ""[uVar35];
                              if (((psVar42[bVar6] != 0) &&
                                  (iVar39 = stbi__jpeg_get_bit(z), iVar39 != 0)) &&
                                 (sVar2 = psVar42[bVar6], (uVar25 & (int)sVar2) == 0)) {
                                uVar36 = -uVar25;
                                if (0 < sVar2) {
                                  uVar36 = uVar25;
                                }
                                psVar42[bVar6] = (short)uVar36 + sVar2;
                              }
                              bVar43 = (long)uVar35 < (long)z->spec_end;
                              uVar35 = uVar35 + 1;
                            } while (bVar43);
                          }
                        }
LAB_00109757:
                        uVar38 = 1;
                      }
LAB_0010975c:
                      bVar43 = (int)uVar38 == 0;
                      if (bVar43) {
                        local_188._0_4_ = 0;
                      }
                      local_188 = (ulong)(uint)local_188;
                      paVar28 = local_128;
                      if (bVar43) {
                        bVar43 = false;
                      }
                      else {
LAB_00109781:
                        iVar39 = z->todo;
                        z->todo = iVar39 + -1;
                        bVar43 = true;
                        if (iVar39 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar38 = extraout_RDX_05;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar39 = z->restart_interval;
                            uVar38 = 0x7fffffff;
                            if (iVar39 == 0) {
                              iVar39 = 0x7fffffff;
                            }
                            z->todo = iVar39;
                            z->eob_run = 0;
                          }
                          else {
                            local_188 = 1;
                            bVar43 = false;
                          }
                        }
                      }
                    }
                    uVar25 = (uint)uVar38;
                    if (!bVar43) {
                      uVar35 = local_188 & 0xffffffff;
                      goto LAB_0010a007;
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 != local_130);
                }
                uVar25 = (uint)uVar38;
                uVar35 = 1;
                iVar13 = iVar13 + 1;
              } while (iVar13 != local_12c);
            }
          }
          else {
            uVar35 = 1;
            if (0 < z->img_mcu_y) {
              iVar13 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar17 = 0;
                  do {
                    if (0 < z->scan_n) {
                      uVar35 = 0;
                      do {
                        local_1a8 = uVar35;
                        iVar39 = z->order[local_1a8];
                        if (0 < z->img_comp[iVar39].v) {
                          iVar24 = 0;
                          bVar43 = true;
                          do {
                            iVar14 = paVar1[iVar39].h;
                            if (0 < iVar14) {
                              iVar40 = 0;
                              do {
                                iVar14 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar39].coeff +
                                                      (iVar14 * iVar17 + iVar40 +
                                                      (paVar1[iVar39].v * iVar13 + iVar24) *
                                                      paVar1[iVar39].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar39].hd,iVar39);
                                uVar25 = (uint)extraout_RDX_09;
                                uVar38 = extraout_RDX_09;
                                if (iVar14 == 0) {
                                  if (bVar43) goto LAB_00109fe7;
                                  goto LAB_00109c96;
                                }
                                iVar40 = iVar40 + 1;
                                iVar14 = paVar1[iVar39].h;
                              } while (iVar40 < iVar14);
                            }
                            iVar24 = iVar24 + 1;
                            bVar43 = iVar24 < paVar1[iVar39].v;
                          } while (iVar24 < paVar1[iVar39].v);
                        }
LAB_00109c96:
                        uVar35 = local_1a8 + 1;
                      } while ((long)(local_1a8 + 1) < (long)z->scan_n);
                    }
                    uVar25 = (uint)uVar38;
                    iVar39 = z->todo;
                    z->todo = iVar39 + -1;
                    if (iVar39 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar25 = extraout_EDX_01;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_00109d7b;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar39 = z->restart_interval;
                      uVar38 = 0x7fffffff;
                      if (iVar39 == 0) {
                        iVar39 = 0x7fffffff;
                      }
                      z->todo = iVar39;
                      z->eob_run = 0;
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < z->img_mcu_x);
                }
                uVar25 = (uint)uVar38;
                iVar13 = iVar13 + 1;
              } while (iVar13 < z->img_mcu_y);
LAB_00109d7b:
              uVar35 = 1;
            }
          }
          goto LAB_0010a007;
        }
        pcVar18 = "bad SOS component count";
        paVar28 = extraout_RDX_03;
LAB_0010aacd:
        uVar25 = (uint)paVar28;
        *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
        goto LAB_0010aad6;
      }
      if (uVar36 == 0xdc) goto LAB_0010915a;
      if (uVar36 == 0xd9) {
        if ((z->progressive != 0) && (0 < z->s->img_n)) {
          lVar19 = 0;
          do {
            iVar13 = z->img_comp[lVar19].y + 7 >> 3;
            if (0 < iVar13) {
              uVar25 = paVar1[lVar19].x + 7 >> 3;
              iVar17 = 0;
              do {
                if (0 < (int)uVar25) {
                  uVar38 = 0;
                  do {
                    psVar42 = paVar1[lVar19].coeff +
                              (paVar1[lVar19].coeff_w * iVar17 + (int)uVar38) * 0x40;
                    iVar39 = paVar1[lVar19].tq;
                    lVar26 = 0;
                    do {
                      psVar42[lVar26] = psVar42[lVar26] * z->dequant[iVar39][lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar19].data +
                               uVar38 * 8 + (long)(iVar17 * 8 * paVar1[lVar19].w2),paVar1[lVar19].w2
                               ,psVar42);
                    uVar38 = uVar38 + 1;
                    uVar29 = extraout_RDX_13;
                  } while (uVar38 != uVar25);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar13);
            }
            uVar25 = (uint)uVar29;
            lVar19 = lVar19 + 1;
          } while (lVar19 < z->s->img_n);
        }
      }
      else {
        iVar13 = stbi__process_marker(z,uVar36);
        uVar25 = extraout_EDX_00;
        if (iVar13 != 0) goto LAB_0010914d;
      }
      if (req_comp == 0) {
        req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
      }
      uVar36 = z->s->img_n;
      if (uVar36 == 3) {
        bVar43 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_0010a255;
          bVar43 = z->jfif == 0;
        }
      }
      else {
LAB_0010a255:
        bVar43 = false;
      }
      uVar41 = 1;
      if (bVar43) {
        uVar41 = uVar36;
      }
      if (2 < req_comp) {
        uVar41 = uVar36;
      }
      if (uVar36 != 3) {
        uVar41 = uVar36;
      }
      if (0 < (int)uVar41) {
        local_158[2] = (stbi_uc *)0x0;
        local_158[3] = (stbi_uc *)0x0;
        local_158[0] = (stbi_uc *)0x0;
        local_158[1] = (stbi_uc *)0x0;
        pvVar22 = (void *)0x0;
        lVar19 = 0;
        do {
          psVar34 = z->s;
          sVar3 = psVar34->img_x;
          pvVar20 = malloc((ulong)(sVar3 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar19 * 2) = pvVar20;
          if (pvVar20 == (void *)0x0) {
            stbi__free_jpeg_components(z,psVar34->img_n,why);
            *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
          }
          else {
            uVar38 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar19 * 2);
            iVar13 = (int)uVar38;
            *(int *)((long)local_e0 + lVar19) = iVar13;
            iVar17 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar19 * 2);
            *(int *)((long)local_e0 + lVar19 + 4) = iVar17;
            *(int *)((long)local_e0 + lVar19 + 0xc) = iVar17 >> 1;
            *(int *)((long)local_e0 + lVar19 + 8) =
                 (int)((ulong)((sVar3 + iVar13) - 1) / (uVar38 & 0xffffffff));
            *(undefined4 *)((long)local_e0 + lVar19 + 0x10) = 0;
            uVar29 = *(undefined8 *)((long)&z->img_comp[0].data + lVar19 * 2);
            *(undefined8 *)((long)local_f0 + lVar19 + 8) = uVar29;
            *(undefined8 *)((long)local_f0 + lVar19) = uVar29;
            if ((iVar13 == 1) && (iVar17 == 1)) {
              pcVar21 = resample_row_1;
            }
            else if ((iVar13 == 1) && (iVar17 == 2)) {
              pcVar21 = stbi__resample_row_v_2;
            }
            else if ((iVar13 == 2) && (iVar17 == 1)) {
              pcVar21 = stbi__resample_row_h_2;
            }
            else if ((iVar13 == 2) && (iVar17 == 2)) {
              pcVar21 = z->resample_row_hv_2_kernel;
            }
            else {
              pcVar21 = stbi__resample_row_generic;
            }
            *(code **)((long)local_f8 + lVar19) = pcVar21;
          }
          if (pvVar20 == (void *)0x0) goto LAB_0010aae8;
          lVar19 = lVar19 + 0x30;
        } while ((ulong)uVar41 * 0x30 != lVar19);
        psVar34 = z->s;
        sVar3 = psVar34->img_y;
        pvVar22 = stbi__malloc_mad3(req_comp,psVar34->img_x,sVar3,1);
        if (pvVar22 != (void *)0x0) {
          iVar13 = why_00;
          if (sVar3 != 0) {
            iVar17 = 0;
            uVar25 = 0;
            do {
              sVar3 = psVar34->img_x;
              ppsVar31 = local_158;
              lVar19 = 0;
              do {
                puVar23 = (undefined8 *)((long)local_f0 + lVar19 + 8);
                iVar13 = *(int *)((long)local_e0 + lVar19 + 0xc);
                iVar39 = *(int *)((long)local_e0 + lVar19 + 4);
                iVar24 = iVar39 >> 1;
                puVar27 = puVar23;
                if (iVar13 < iVar24) {
                  puVar27 = (undefined8 *)((long)local_f0 + lVar19);
                }
                if (iVar24 <= iVar13) {
                  puVar23 = (undefined8 *)((long)local_f0 + lVar19);
                }
                auVar44 = (**(code **)((long)local_f8 + lVar19))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar19 * 2),
                                     *puVar27,*puVar23,*(undefined4 *)((long)local_e0 + lVar19 + 8))
                ;
                psVar30 = auVar44._8_8_;
                *ppsVar31 = auVar44._0_8_;
                *(int *)((long)local_e0 + lVar19 + 0xc) = iVar13 + 1;
                if (iVar39 <= iVar13 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar19 + 0xc) = 0;
                  lVar26 = *(long *)((long)local_f0 + lVar19 + 8);
                  *(long *)((long)local_f0 + lVar19) = lVar26;
                  iVar13 = *(int *)((long)local_e0 + lVar19 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar19 + 0x10) = iVar13;
                  if (iVar13 < *(int *)((long)&z->img_comp[0].y + lVar19 * 2)) {
                    *(long *)((long)local_f0 + lVar19 + 8) =
                         lVar26 + *(int *)((long)&z->img_comp[0].w2 + lVar19 * 2);
                  }
                }
                lVar19 = lVar19 + 0x30;
                ppsVar31 = ppsVar31 + 1;
              } while ((ulong)uVar41 * 0x30 != lVar19);
              if (req_comp < 3) {
                psVar34 = z->s;
                if (bVar43) {
                  if (req_comp == 1) {
                    if (psVar34->img_x != 0) {
                      uVar38 = 0;
                      do {
                        bVar6 = local_158[2][uVar38];
                        *(char *)((long)pvVar22 + uVar38 + sVar3 * iVar17) =
                             (char)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                                    (uint)local_158[1][uVar38] * 0x96 +
                                    (uint)local_158[0][uVar38] * 0x4d >> 8);
                        uVar38 = uVar38 + 1;
                        psVar30 = local_158[1];
                      } while (uVar38 < psVar34->img_x);
                    }
                  }
                  else if (psVar34->img_x != 0) {
                    uVar38 = 0;
                    do {
                      bVar6 = local_158[2][uVar38];
                      *(char *)((long)pvVar22 + uVar38 * 2 + (ulong)(sVar3 * iVar17)) =
                           (char)((uint)bVar6 * 2 + ((uint)bVar6 + (uint)bVar6 * 8) * 3 +
                                  (uint)local_158[1][uVar38] * 0x96 +
                                  (uint)local_158[0][uVar38] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar22 + uVar38 * 2 + (ulong)(sVar3 * iVar17) + 1) =
                           0xff;
                      uVar38 = uVar38 + 1;
                      psVar30 = local_158[1];
                    } while (uVar38 < psVar34->img_x);
                  }
                }
                else if (psVar34->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 1);
                      uVar38 = 0;
                      do {
                        iVar13 = (local_158[0][uVar38] ^ 0xff) * (uint)local_158[3][uVar38];
                        puVar32[-1] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        *puVar32 = 0xff;
                        uVar38 = uVar38 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[3];
                      } while (uVar38 < psVar34->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0010a82e;
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 1);
                      uVar38 = 0;
                      do {
                        bVar6 = local_158[3][uVar38];
                        iVar13 = (uint)local_158[0][uVar38] * (uint)bVar6;
                        iVar39 = (uint)local_158[1][uVar38] * (uint)bVar6;
                        puVar32[-1] = (char)(((uint)local_158[2][uVar38] * (uint)bVar6 +
                                              ((uint)local_158[2][uVar38] * (uint)bVar6 + 0x80 >> 8)
                                              + 0x80 >> 8 & 0xff) * 0x1d +
                                             (iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                             0x96 + (iVar13 + (iVar13 + 0x80U >> 8) + 0x80 >> 8 &
                                                    0xff) * 0x4d >> 8);
                        *puVar32 = 0xff;
                        uVar38 = uVar38 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[0];
                      } while (uVar38 < psVar34->img_x);
                    }
                  }
                }
                else {
LAB_0010a82e:
                  uVar36 = psVar34->img_x;
                  psVar30 = (stbi_uc *)(ulong)uVar36;
                  if (req_comp == 1) {
                    if (uVar36 != 0) {
                      psVar30 = (stbi_uc *)0x0;
                      do {
                        psVar30[(ulong)(sVar3 * iVar17) + (long)pvVar22] =
                             local_158[0][(long)psVar30];
                        psVar30 = psVar30 + 1;
                      } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                    }
                  }
                  else if (uVar36 != 0) {
                    psVar30 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar22 + (long)psVar30 * 2 + (ulong)(sVar3 * iVar17)) =
                           local_158[0][(long)psVar30];
                      *(undefined1 *)
                       ((long)pvVar22 + (long)psVar30 * 2 + (ulong)(sVar3 * iVar17) + 1) = 0xff;
                      psVar30 = psVar30 + 1;
                    } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                  }
                }
              }
              else {
                psVar37 = (stbi_uc *)((ulong)(uVar25 * req_comp * sVar3) + (long)pvVar22);
                psVar34 = z->s;
                if (psVar34->img_n == 3) {
                  if (bVar43) {
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 3);
                      uVar38 = 0;
                      do {
                        puVar32[-3] = local_158[0][uVar38];
                        puVar32[-2] = local_158[1][uVar38];
                        puVar32[-1] = local_158[2][uVar38];
                        *puVar32 = 0xff;
                        uVar38 = uVar38 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[2];
                      } while (uVar38 < psVar34->img_x);
                    }
                  }
                  else {
LAB_0010a89c:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar37,local_158[0],local_158[1],local_158[2],psVar34->img_x,
                               req_comp);
                    psVar30 = extraout_RDX_14;
                  }
                }
                else if (psVar34->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar37,local_158[0],local_158[1],local_158[2],psVar34->img_x,
                               req_comp);
                    psVar34 = z->s;
                    psVar30 = extraout_RDX_15;
                    if (psVar34->img_x != 0) {
                      pbVar33 = (byte *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 2);
                      psVar30 = (stbi_uc *)0x0;
                      do {
                        bVar6 = local_158[3][(long)psVar30];
                        iVar13 = (pbVar33[-2] ^ 0xff) * (uint)bVar6;
                        pbVar33[-2] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (pbVar33[-1] ^ 0xff) * (uint)bVar6;
                        pbVar33[-1] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (*pbVar33 ^ 0xff) * (uint)bVar6;
                        *pbVar33 = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        psVar30 = psVar30 + 1;
                        pbVar33 = pbVar33 + (uint)req_comp;
                      } while (psVar30 < (stbi_uc *)(ulong)psVar34->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0010a89c;
                    if (psVar34->img_x != 0) {
                      puVar32 = (undefined1 *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 3);
                      uVar38 = 0;
                      do {
                        bVar6 = local_158[3][uVar38];
                        iVar13 = (uint)local_158[0][uVar38] * (uint)bVar6;
                        puVar32[-3] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (uint)local_158[1][uVar38] * (uint)bVar6;
                        puVar32[-2] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        puVar32[-1] = (char)(((uint)local_158[2][uVar38] * (uint)bVar6 + 0x80 >> 8)
                                             + (uint)local_158[2][uVar38] * (uint)bVar6 + 0x80 >> 8)
                        ;
                        *puVar32 = 0xff;
                        uVar38 = uVar38 + 1;
                        puVar32 = puVar32 + (uint)req_comp;
                        psVar30 = local_158[1];
                      } while (uVar38 < psVar34->img_x);
                    }
                  }
                }
                else if (psVar34->img_x != 0) {
                  puVar32 = (undefined1 *)((long)pvVar22 + (ulong)(sVar3 * iVar17) + 3);
                  psVar37 = (stbi_uc *)0x0;
                  do {
                    sVar7 = local_158[0][(long)psVar37];
                    puVar32[-1] = sVar7;
                    puVar32[-2] = sVar7;
                    puVar32[-3] = sVar7;
                    *puVar32 = 0xff;
                    psVar37 = psVar37 + 1;
                    psVar30 = (stbi_uc *)(ulong)psVar34->img_x;
                    puVar32 = puVar32 + (uint)req_comp;
                  } while (psVar37 < psVar30);
                }
              }
              iVar13 = (int)psVar30;
              uVar25 = uVar25 + 1;
              psVar34 = z->s;
              iVar17 = iVar17 + req_comp;
            } while (uVar25 < psVar34->img_y);
          }
          stbi__free_jpeg_components(z,psVar34->img_n,iVar13);
          psVar34 = z->s;
          *local_110 = psVar34->img_x;
          *local_108 = psVar34->img_y;
          if (local_100 != (int *)0x0) {
            *local_100 = (uint)(2 < psVar34->img_n) * 2 + 1;
          }
          goto LAB_0010aae8;
        }
        stbi__free_jpeg_components(z,psVar34->img_n,why_00);
        pcVar18 = "outofmem";
        goto LAB_0010906d;
      }
    }
    stbi__free_jpeg_components(z,uVar36,uVar25);
  }
  else {
    pcVar18 = "bad req_comp";
LAB_0010906d:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
  }
  pvVar22 = (void *)0x0;
LAB_0010aae8:
  free(z);
  return pvVar22;
LAB_00109fe7:
  uVar35 = 0;
LAB_0010a007:
  if ((int)uVar35 == 0) goto LAB_0010aad6;
  if (z->marker == 0xff) {
    do {
      psVar34 = z->s;
      if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010a03e:
        if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0010a0c0:
          uVar12 = 0xff;
          break;
        }
      }
      else {
        iVar13 = (*(psVar34->io).eof)(psVar34->io_user_data);
        if (iVar13 != 0) {
          if (psVar34->read_from_callbacks != 0) goto LAB_0010a03e;
          goto LAB_0010a0c0;
        }
      }
      bVar6 = stbi__get8(z->s);
      uVar25 = (uint)bVar6;
      do {
        uVar36 = uVar25;
        if (uVar36 != 0xff) {
          uVar25 = (uint)uVar35;
          break;
        }
        psVar34 = z->s;
        if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010a081:
          if (psVar34->img_buffer_end <= psVar34->img_buffer) {
LAB_0010a0a7:
            uVar25 = 0xff;
            break;
          }
        }
        else {
          iVar13 = (*(psVar34->io).eof)(psVar34->io_user_data);
          if (iVar13 != 0) {
            if (psVar34->read_from_callbacks != 0) goto LAB_0010a081;
            goto LAB_0010a0a7;
          }
        }
        bVar6 = stbi__get8(z->s);
        uVar25 = (uint)bVar6;
      } while (0xfd < (byte)(bVar6 - 1));
      uVar12 = (uchar)uVar25;
      uVar35 = (ulong)uVar25;
    } while (uVar36 != 0xff);
    z->marker = uVar12;
  }
  bVar6 = stbi__get_marker(z);
  uVar36 = (uint)bVar6;
  uVar29 = extraout_RDX_12;
  if ((bVar6 & 0xf8) == 0xd0) {
LAB_0010914d:
    bVar6 = stbi__get_marker(z);
    uVar36 = (uint)bVar6;
    uVar29 = extraout_RDX_00;
  }
  goto LAB_0010911d;
LAB_0010915a:
  psVar34 = z->s;
  sVar7 = stbi__get8(psVar34);
  sVar8 = stbi__get8(psVar34);
  psVar34 = z->s;
  sVar9 = stbi__get8(psVar34);
  sVar10 = stbi__get8(psVar34);
  uVar29 = extraout_RDX_01;
  if (CONCAT11(sVar7,sVar8) == 4) {
    if ((uint)CONCAT11(sVar9,sVar10) == z->s->img_y) {
      bVar6 = stbi__get_marker(z);
      uVar36 = (uint)bVar6;
      bVar43 = true;
      uVar29 = extraout_RDX_02;
    }
    else {
      *(char **)(in_FS_OFFSET + -0x20) = "bad DNL height";
      uVar36 = 0xdc;
      bVar43 = false;
    }
  }
  else {
    *(char **)(in_FS_OFFSET + -0x20) = "bad DNL len";
    uVar36 = 0xdc;
    bVar43 = false;
  }
  uVar25 = (uint)uVar29;
  if (!bVar43) goto LAB_0010aad6;
  goto LAB_0010911d;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}